

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_clear_error.c
# Opt level: O0

void test_archive_clear_error(void)

{
  archive *a_00;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  char *in_stack_00000008;
  archive *a;
  char *in_stack_00000018;
  void *in_stack_00000020;
  void *in_stack_00000030;
  wchar_t in_stack_00000038;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar1;
  uint in_stack_fffffffffffffff4;
  
  a_00 = archive_read_new();
  archive_set_error(a_00,0xc,"abcdefgh");
  archive_errno(a_00);
  assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)a_00,
                      (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),0,
                      (char *)0x123701,in_stack_00000020);
  archive_error_string(a_00);
  uVar1 = 0;
  assertion_equal_string
            (in_stack_00000018,a._4_4_,in_stack_00000008,
             (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)a_00,
             (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,in_stack_00000038)
  ;
  archive_clear_error(a_00);
  archive_errno(a_00);
  assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)a_00,
                      (char *)CONCAT44(in_stack_fffffffffffffff4,uVar1),0,(char *)0x12378a,
                      in_stack_00000020);
  archive_error_string(a_00);
  assertion_equal_string
            (in_stack_00000018,a._4_4_,in_stack_00000008,
             (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)a_00,
             (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,in_stack_00000038)
  ;
  archive_read_free((archive *)0x1237d6);
  return;
}

Assistant:

DEFINE_TEST(test_archive_clear_error)
{
	struct archive* a = archive_read_new();

	archive_set_error(a, 12, "abcdefgh");
	assertEqualInt(12, archive_errno(a));
	assertEqualString("abcdefgh", archive_error_string(a));

	archive_clear_error(a);
	assertEqualInt(0, archive_errno(a));
	assertEqualString(NULL, archive_error_string(a));

	archive_read_free(a);
}